

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UUID.cpp
# Opt level: O2

string * UUID::newUUID_abi_cxx11_(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  char cVar13;
  int iVar14;
  CryptoFactory *pCVar15;
  undefined4 extraout_var;
  byte *pbVar16;
  undefined4 *puVar17;
  string *in_RDI;
  allocator local_cd;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  ByteString uuid;
  char uuidStr [37];
  
  pCVar15 = CryptoFactory::i();
  iVar14 = (*pCVar15->_vptr_CryptoFactory[8])(pCVar15,1);
  ByteString::ByteString(&uuid);
  cVar13 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar14) + 0x10))
                     ((long *)CONCAT44(extraout_var,iVar14),&uuid,0x10);
  if (cVar13 != '\0') {
    pbVar16 = ByteString::operator[](&uuid,0);
    local_c4 = (uint)*pbVar16;
    pbVar16 = ByteString::operator[](&uuid,1);
    local_c8 = (uint)*pbVar16;
    pbVar16 = ByteString::operator[](&uuid,2);
    local_cc = (uint)*pbVar16;
    pbVar16 = ByteString::operator[](&uuid,3);
    bVar1 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,4);
    bVar2 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,5);
    bVar3 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,6);
    bVar4 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,7);
    bVar5 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,8);
    bVar6 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,9);
    bVar7 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,10);
    bVar8 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,0xb);
    bVar9 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,0xc);
    bVar10 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,0xd);
    bVar11 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,0xe);
    bVar12 = *pbVar16;
    pbVar16 = ByteString::operator[](&uuid,0xf);
    snprintf(uuidStr,0x25,"%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
             (ulong)local_c4,(ulong)local_c8,(ulong)local_cc,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,
             (ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8,(ulong)bVar9,
             (ulong)bVar10,(ulong)bVar11,(ulong)bVar12,(ulong)*pbVar16);
    std::__cxx11::string::string((string *)in_RDI,uuidStr,&local_cd);
    ByteString::~ByteString(&uuid);
    return in_RDI;
  }
  softHSMLog(3,"newUUID",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/UUID.cpp"
             ,0x33,"Fatal, could not generate random UUID");
  puVar17 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar17 = 0xffffffff;
  __cxa_throw(puVar17,&int::typeinfo,0);
}

Assistant:

std::string UUID::newUUID()
{
	RNG* rng = CryptoFactory::i()->getRNG();

	ByteString uuid;

	if (!rng->generateRandom(uuid, 16))
	{
		ERROR_MSG("Fatal, could not generate random UUID");

		throw -1;
	}

	// Convert it to a string
	char uuidStr[37];
	snprintf(uuidStr, sizeof(uuidStr),
		"%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
		uuid[0], uuid[1], uuid[2], uuid[3],
		uuid[4], uuid[5],
		uuid[6], uuid[7],
		uuid[8], uuid[9],
		uuid[10], uuid[11], uuid[12], uuid[13], uuid[14], uuid[15]);

	return std::string(uuidStr);
}